

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolPartialJPolValPair.cpp
# Opt level: O0

PartialPolicyPoolInterface * __thiscall
PolicyPoolPartialJPolValPair::operator=
          (PolicyPoolPartialJPolValPair *this,PartialPolicyPoolInterface *o)

{
  PolicyPoolPartialJPolValPair *o_00;
  PolicyPoolPartialJPolValPair *in_RSI;
  PolicyPoolPartialJPolValPair *in_RDI;
  PolicyPoolPartialJPolValPair *casted_o;
  PolicyPoolPartialJPolValPair *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    o_00 = (PolicyPoolPartialJPolValPair *)
           __dynamic_cast(in_RSI,&PartialPolicyPoolInterface::typeinfo,&typeinfo,0);
    if (o_00 == (PolicyPoolPartialJPolValPair *)0x0) {
      __cxa_bad_cast();
    }
    local_8 = operator=(in_RDI,o_00);
  }
  return &local_8->super_PartialPolicyPoolInterface;
}

Assistant:

PartialPolicyPoolInterface& PolicyPoolPartialJPolValPair::operator= 
    (const PartialPolicyPoolInterface& o)
{
    if(DEBUG_PPJPVP_ASSIGN)
        cout <<"PartialPolicyPoolInterface& PolicyPoolPartialJPolValPair::operator= \
called."<<endl;
    if (this == &o) return *this;   // Gracefully handle self assignment
    const PolicyPoolPartialJPolValPair& casted_o = 
        dynamic_cast<const PolicyPoolPartialJPolValPair&>(o);

    return(operator=(casted_o));

}